

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeSelect(TranslateToFuzzReader *this,Type type)

{
  Type type_00;
  Type type_01;
  Expression *pEVar1;
  ThreeArgs local_48;
  
  type_00 = getSubType(this,type);
  type_01 = getSubType(this,type);
  local_48.a = make(this,(Type)0x2);
  local_48.b = make(this,type_00);
  local_48.c = make(this,type_01);
  pEVar1 = buildSelect(this,&local_48,type);
  return pEVar1;
}

Assistant:

Expression* TranslateToFuzzReader::makeSelect(Type type) {
  Type subType1 = getSubType(type);
  Type subType2 = getSubType(type);
  return buildSelect({make(Type::i32), make(subType1), make(subType2)}, type);
}